

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProString * __thiscall QMakeEvaluator::first(QMakeEvaluator *this,ProKey *variableName)

{
  long lVar1;
  bool bVar2;
  ProKey *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  ProStringList *vals;
  QMakeEvaluator *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  values(in_RDI,in_RSI);
  bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x2f7608);
  if (bVar2) {
    ProString::ProString((ProString *)this_00);
  }
  else {
    QList<ProString>::first((QList<ProString> *)this_00);
    ProString::ProString((ProString *)this_00,(ProString *)in_RDI);
  }
  ProStringList::~ProStringList((ProStringList *)0x2f7647);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ProString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeEvaluator::first(const ProKey &variableName) const
{
    const ProStringList &vals = values(variableName);
    if (!vals.isEmpty())
        return vals.first();
    return ProString();
}